

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void action_wiresnips(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  long lVar4;
  
  bVar1 = (state->hero_mappos).v;
  lVar4 = 0;
  do {
    if (((&walls[0xc].miny)[lVar4] <= bVar1) && (bVar1 < (&walls[0xc].maxy)[lVar4])) {
      bVar2 = (state->hero_mappos).u;
      if (bVar2 == (&walls[0xc].maxx)[lVar4]) {
        uVar3 = '\x04';
        goto LAB_001061f0;
      }
      if (bVar2 - 1 == (uint)(&walls[0xc].maxx)[lVar4]) {
        uVar3 = '\x06';
        goto LAB_001061f0;
      }
    }
    lVar4 = lVar4 + 6;
  } while ((char)lVar4 != '\x18');
  bVar2 = (state->hero_mappos).u;
  lVar4 = 0;
  do {
    if (((&walls[0x10].minx)[lVar4] <= bVar2) && (bVar2 < (&walls[0x10].maxx)[lVar4])) {
      if (bVar1 == (&walls[0x10].miny)[lVar4]) {
        uVar3 = '\x05';
LAB_001061f0:
        state->vischars[0].direction = uVar3;
        state->vischars[0].input = 0x80;
        state->vischars[0].flags = '\x02';
        state->vischars[0].mi.mappos.w = 0xc;
        state->vischars[0].mi.sprite = sprites + 2;
        state->player_locked_out_until = state->game_counter + '`';
        queue_message(state,message_CUTTING_THE_WIRE);
        return;
      }
      if (bVar1 - 1 == (uint)(&walls[0x10].miny)[lVar4]) {
        uVar3 = '\a';
        goto LAB_001061f0;
      }
    }
    lVar4 = lVar4 + 6;
    if ((char)lVar4 == '\x12') {
      return;
    }
  } while( true );
}

Assistant:

void action_wiresnips(tgestate_t *state)
{
  const wall_t    *wall;   /* was HL */
  const mappos8_t *mappos; /* was DE */
  uint8_t          iters;  /* was B */
  uint8_t          flag;   /* was A */

  assert(state != NULL);

  wall = &walls[12]; /* start of (vertical) fences */
  mappos = &state->hero_mappos;
  iters = 4;
  do
  {
    uint8_t coord; /* was A */

    // check: this is using x then y which is the wrong order, isn't it?
    coord = mappos->v;
    if (coord >= wall->miny && coord < wall->maxy) /* Conv: Reversed test order. */
    {
      coord = mappos->u;
      if (coord == wall->maxx)
        goto snips_crawl_tl;
      if (coord - 1 == wall->maxx)
        goto snips_crawl_br;
    }

    wall++;
  }
  while (--iters);

  wall = &walls[12 + 4]; /* start of (horizontal) fences */
  mappos = &state->hero_mappos;
  iters = 3;
  do
  {
    uint8_t coord; /* was A */

    coord = mappos->u;
    if (coord >= wall->minx && coord < wall->maxx)
    {
      coord = mappos->v;
      if (coord == wall->miny)
        goto snips_crawl_tr;
      if (coord - 1 == wall->miny)
        goto snips_crawl_bl;
    }

    wall++;
  }
  while (--iters);

  return;

snips_crawl_tl: /* Crawl TL */
  flag = direction_TOP_LEFT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_tr: /* Crawl TR */
  flag = direction_TOP_RIGHT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_br: /* Crawl BR */
  flag = direction_BOTTOM_RIGHT | vischar_DIRECTION_CRAWL;
  goto action_wiresnips_tail;

snips_crawl_bl: /* Crawl BL */
  flag = direction_BOTTOM_LEFT | vischar_DIRECTION_CRAWL;

action_wiresnips_tail:
  state->vischars[0].direction   = flag; // dir + walk/crawl flag
  state->vischars[0].input       = input_KICK;
  state->vischars[0].flags       = vischar_FLAGS_CUTTING_WIRE;
  state->vischars[0].mi.mappos.w = 12; // crawling height
  state->vischars[0].mi.sprite   = &sprites[sprite_PRISONER_FACING_AWAY_1];
  state->player_locked_out_until = state->game_counter + 96;
  queue_message(state, message_CUTTING_THE_WIRE);
}